

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

void Assimp::FBX::ParseVectorDataArray
               (vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *out,Element *el)

{
  Token *t;
  pointer ppTVar1;
  char *end;
  undefined1 auVar2 [8];
  size_t __n;
  Scope *sc;
  Element *pEVar3;
  Element *in_R9;
  pointer ppTVar4;
  value_type vVar5;
  long lVar6;
  int iVar7;
  ulong __n_00;
  float fVar8;
  char type;
  vector<char,_std::allocator<char>_> buff;
  char *data;
  uint32_t count;
  byte local_69;
  undefined1 local_68 [8];
  pointer pcStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  aiVector2t<float> local_48;
  char *local_40;
  uint local_34;
  
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize(out,0);
  ppTVar4 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar4 ==
      (el->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string
              ((string *)local_68,"unexpected empty element",(allocator *)&local_40);
    anon_unknown.dwarf_1e32c8::ParseError((string *)local_68,el);
  }
  t = *ppTVar4;
  if (t->column == 0xffffffff) {
    local_40 = t->sbegin;
    end = t->send;
    anon_unknown_20::ReadBinaryDataArrayHead(&local_40,end,(char *)&local_69,&local_34,el);
    if ((local_34 & 1) != 0) {
      std::__cxx11::string::string
                ((string *)local_68,"number of floats is not a multiple of two (2) (binary)",
                 (allocator *)&local_48);
      anon_unknown.dwarf_1e32c8::ParseError((string *)local_68,el);
    }
    if (local_34 != 0) {
      if ((local_69 & 0xfd) != 100) {
        std::__cxx11::string::string
                  ((string *)local_68,"expected float or double array (binary)",
                   (allocator *)&local_48);
        anon_unknown.dwarf_1e32c8::ParseError((string *)local_68,el);
      }
      local_68._0_4_ = 0.0;
      local_68._4_4_ = 0.0;
      pcStack_60 = (pointer)0x0;
      local_58._M_allocated_capacity = 0;
      anon_unknown_20::ReadBinaryDataArray
                (local_69,local_34,&local_40,end,(vector<char,_std::allocator<char>_> *)local_68,
                 in_R9);
      __n_00 = (ulong)(local_34 >> 1);
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::reserve(out,__n_00);
      auVar2 = local_68;
      if (local_69 == 0x66) {
        for (lVar6 = 0; local_34 >> 1 != (uint)lVar6; lVar6 = lVar6 + 1) {
          local_48 = *(aiVector2t<float> *)((long)auVar2 + lVar6 * 8);
          std::vector<aiVector2t<float>,std::allocator<aiVector2t<float>>>::
          emplace_back<aiVector2t<float>>
                    ((vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *)out,&local_48);
        }
      }
      else if (local_69 == 100) {
        vVar5 = (value_type)local_68;
        while (iVar7 = (int)__n_00, __n_00 = (ulong)(iVar7 - 1), iVar7 != 0) {
          local_48.y = (float)*(double *)((long)vVar5 + 8);
          local_48.x = (float)*(double *)vVar5;
          std::vector<aiVector2t<float>,std::allocator<aiVector2t<float>>>::
          emplace_back<aiVector2t<float>>
                    ((vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *)out,&local_48);
          vVar5 = (value_type)((long)vVar5 + 0x10);
        }
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)local_68);
    }
  }
  else {
    __n = ParseTokenAsDim(t);
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::reserve(out,__n);
    sc = GetRequiredScope(el);
    std::__cxx11::string::string((string *)local_68,"a",(allocator *)&local_40);
    pEVar3 = GetRequiredElement(sc,(string *)local_68,el);
    std::__cxx11::string::~string((string *)local_68);
    ppTVar4 = (pEVar3->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar1 = (pEVar3->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (((int)ppTVar1 - (int)ppTVar4 & 8U) != 0) {
      std::__cxx11::string::string
                ((string *)local_68,"number of floats is not a multiple of two (2)",
                 (allocator *)&local_40);
      anon_unknown.dwarf_1e32c8::ParseError((string *)local_68,el);
    }
    for (; ppTVar4 != ppTVar1; ppTVar4 = ppTVar4 + 2) {
      local_68._0_4_ = 0.0;
      local_68._4_4_ = 0.0;
      fVar8 = ParseTokenAsFloat(*ppTVar4);
      local_68._0_4_ = fVar8;
      fVar8 = ParseTokenAsFloat(ppTVar4[1]);
      local_68._4_4_ = fVar8;
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::push_back
                (out,(value_type *)local_68);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<aiVector2D>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(count % 2 != 0) {
            ParseError("number of floats is not a multiple of two (2) (binary)",&el);
        }

        if(!count) {
            return;
        }

        if (type != 'd' && type != 'f') {
            ParseError("expected float or double array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * (type == 'd' ? 8 : 4));

        const uint32_t count2 = count / 2;
        out.reserve(count2);

        if (type == 'd') {
            const double* d = reinterpret_cast<const double*>(&buff[0]);
            for (unsigned int i = 0; i < count2; ++i, d += 2) {
                out.push_back(aiVector2D(static_cast<float>(d[0]),
                    static_cast<float>(d[1])));
            }
        }
        else if (type == 'f') {
            const float* f = reinterpret_cast<const float*>(&buff[0]);
            for (unsigned int i = 0; i < count2; ++i, f += 2) {
                out.push_back(aiVector2D(f[0],f[1]));
            }
        }

        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    // see notes in ParseVectorDataArray() above
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    if (a.Tokens().size() % 2 != 0) {
        ParseError("number of floats is not a multiple of two (2)",&el);
    }
    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        aiVector2D v;
        v.x = ParseTokenAsFloat(**it++);
        v.y = ParseTokenAsFloat(**it++);

        out.push_back(v);
    }
}